

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRedcostFixing.cpp
# Opt level: O2

void HighsRedcostFixing::propagateRedCost
               (HighsMipSolver *mipsolver,HighsDomain *localdomain,HighsLpRelaxation *lp)

{
  double v;
  uint col;
  HighsMipSolverData *pHVar1;
  uint *puVar2;
  HighsBoundType HVar3;
  HighsMipSolver *pHVar4;
  bool bVar5;
  byte bVar6;
  HighsInt HVar7;
  HighsInt HVar8;
  uint *puVar9;
  long lVar10;
  pointer pHVar11;
  const_iterator __first;
  HighsDomainChange *domchg_00;
  long lVar13;
  iterator __begin4;
  pointer pHVar14;
  HighsDomainChange *domchg;
  double dVar15;
  double dVar16;
  HighsDomainChange boundchg;
  HighsDomainChange boundchg_00;
  vector<int,_std::allocator<int>_> inds;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> boundChanges;
  vector<double,_std::allocator<double>_> vals;
  double rhs;
  HighsCDouble gap;
  _Vector_base<int,_std::allocator<int>_> local_d8;
  double local_c0;
  _Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_> local_b8;
  _Vector_base<double,_std::allocator<double>_> local_98;
  HighsMipSolver *local_78;
  double dStack_70;
  HighsCDouble local_68;
  HighsCDouble local_58;
  double local_48;
  double dStack_40;
  HighsDomainChange *pHVar12;
  
  local_b8._M_impl.super__Vector_impl_data._M_start =
       (pointer)((mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->upper_limit;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58 = HighsCDouble::operator-((HighsCDouble *)&local_b8,lp->objective);
  local_c0 = local_58.lo;
  local_48 = local_58.hi;
  pHVar1 = (mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  local_78 = (HighsMipSolver *)pHVar1->feastol;
  dStack_70 = pHVar1->epsilon;
  local_b8._M_impl.super__Vector_impl_data._M_start = (HighsDomainChange *)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (HighsDomainChange *)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::reserve
            ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)&local_b8,
             (long)*(pointer *)
                    ((long)&(pHVar1->integral_cols).super__Vector_base<int,_std::allocator<int>_> +
                    8) -
             *(long *)&(pHVar1->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl
             >> 2);
  dStack_40 = (local_48 + local_c0) * dStack_70;
  local_48 = dStack_40;
  if (dStack_40 <= (double)local_78 * 10.0) {
    local_48 = (double)local_78 * 10.0;
  }
  pHVar1 = (mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  puVar9 = *(uint **)&(pHVar1->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl;
  puVar2 = *(uint **)((long)&(pHVar1->integral_cols).super__Vector_base<int,_std::allocator<int>_> +
                     8);
  local_78 = mipsolver;
  while( true ) {
    pHVar4 = local_78;
    if (puVar9 == puVar2) break;
    col = *puVar9;
    dVar15 = (localdomain->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[(int)col];
    dVar16 = (localdomain->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[(int)col];
    if (((dVar15 != dVar16) || (NAN(dVar15) || NAN(dVar16))) &&
       (v = (lp->lpsolver).solution_.col_dual.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start[(int)col], local_48 < ABS(v))) {
      dVar15 = (dVar15 - dVar16) * v;
      if (dVar15 <= local_58.hi + local_58.lo) {
        if (dVar15 < -local_58.lo - local_58.hi) {
          local_68 = HighsCDouble::operator/(&local_58,v);
          local_98._M_impl.super__Vector_impl_data._0_16_ =
               HighsCDouble::operator+
                         (&local_68,
                          (localdomain->col_upper_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[(int)col]);
          local_d8._M_impl.super__Vector_impl_data._0_16_ =
               HighsCDouble::operator-
                         ((HighsCDouble *)&local_98,
                          ((local_78->mipdata_)._M_t.
                           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                           .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                          feastol);
          dVar16 = local_d8._M_impl.super__Vector_impl_data._M_finish;
          dVar15 = ceil(local_d8._M_impl.super__Vector_impl_data._M_start);
          if ((localdomain->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[(int)col] < dVar15 + dVar16) {
            local_c0 = dVar15 + dVar16;
            bVar5 = HighsDomain::isBinary
                              (&((local_78->mipdata_)._M_t.
                                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                                domain,col);
            if (!bVar5) {
              boundchg_00.column = col;
              boundchg_00.boundval = local_c0;
              boundchg_00.boundtype = kLower;
              HighsDomain::changeBound(localdomain,boundchg_00,(Reason)0xfffffffe);
              goto LAB_002e1845;
            }
            local_d8._M_impl.super__Vector_impl_data._M_finish._0_4_ = col;
            local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)local_c0;
            local_d8._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
            std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::
            emplace_back<HighsDomainChange>
                      ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)&local_b8,
                       (HighsDomainChange *)&local_d8);
          }
        }
      }
      else {
        local_68 = HighsCDouble::operator/(&local_58,v);
        local_98._M_impl.super__Vector_impl_data._0_16_ =
             HighsCDouble::operator+
                       (&local_68,
                        (localdomain->col_lower_).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[(int)col]);
        local_d8._M_impl.super__Vector_impl_data._0_16_ =
             HighsCDouble::operator+
                       ((HighsCDouble *)&local_98,
                        ((local_78->mipdata_)._M_t.
                         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                         .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol)
        ;
        dVar16 = local_d8._M_impl.super__Vector_impl_data._M_finish;
        dVar15 = floor(local_d8._M_impl.super__Vector_impl_data._M_start);
        if (dVar15 + dVar16 <
            (localdomain->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[(int)col]) {
          local_c0 = dVar15 + dVar16;
          bVar5 = HighsDomain::isBinary
                            (&((local_78->mipdata_)._M_t.
                               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                              domain,col);
          if (bVar5) {
            local_d8._M_impl.super__Vector_impl_data._M_finish._0_4_ = col;
            local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)local_c0;
            local_d8._M_impl.super__Vector_impl_data._M_finish._4_4_ = kUpper;
            std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::
            emplace_back<HighsDomainChange>
                      ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)&local_b8,
                       (HighsDomainChange *)&local_d8);
          }
          else {
            boundchg.column = (int)((ulong)col | 0x100000000);
            boundchg.boundtype = (int)(((ulong)col | 0x100000000) >> 0x20);
            boundchg.boundval = local_c0;
            HighsDomain::changeBound(localdomain,boundchg,(Reason)0xfffffffe);
LAB_002e1845:
            if (localdomain->infeasible_ != false) goto LAB_002e199a;
          }
        }
      }
    }
    puVar9 = puVar9 + 1;
  }
  if (local_b8._M_impl.super__Vector_impl_data._M_start ==
      local_b8._M_impl.super__Vector_impl_data._M_finish) goto LAB_002e199a;
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
  pHVar11 = local_b8._M_impl.super__Vector_impl_data._M_finish;
  pHVar14 = local_b8._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)local_b8._M_impl.super__Vector_impl_data._M_finish -
             (long)local_b8._M_impl.super__Vector_impl_data._M_start) < 0x650) {
    pHVar1 = (local_78->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    bVar5 = HighsLpRelaxation::computeDualProof
                      (lp,&pHVar1->domain,pHVar1->upper_limit,
                       (vector<int,_std::allocator<int>_> *)&local_d8,
                       (vector<double,_std::allocator<double>_> *)&local_98,&local_68.hi,false);
    pHVar11 = local_b8._M_impl.super__Vector_impl_data._M_finish;
    pHVar14 = local_b8._M_impl.super__Vector_impl_data._M_start;
    if (!bVar5) goto LAB_002e194b;
    HVar7 = HighsConflictPool::getNumConflicts
                      (&((pHVar4->mipdata_)._M_t.
                         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                         .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                        conflictPool);
    pHVar11 = local_b8._M_impl.super__Vector_impl_data._M_finish;
    for (pHVar14 = local_b8._M_impl.super__Vector_impl_data._M_start; pHVar14 != pHVar11;
        pHVar14 = pHVar14 + 1) {
      bVar5 = HighsDomain::isActive(localdomain,pHVar14);
      if (!bVar5) {
        HighsDomain::conflictAnalyzeReconvergence
                  (localdomain,pHVar14,local_d8._M_impl.super__Vector_impl_data._M_start,
                   local_98._M_impl.super__Vector_impl_data._M_start,
                   (HighsInt)
                   ((ulong)((long)local_d8._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_d8._M_impl.super__Vector_impl_data._M_start) >> 2),
                   local_68.hi,
                   &((pHVar4->mipdata_)._M_t.
                     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                     .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->conflictPool
                  );
      }
    }
    HVar8 = HighsConflictPool::getNumConflicts
                      (&((pHVar4->mipdata_)._M_t.
                         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                         .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                        conflictPool);
    if (HVar8 == HVar7) {
LAB_002e1af3:
      pHVar11 = local_b8._M_impl.super__Vector_impl_data._M_finish;
      pHVar14 = local_b8._M_impl.super__Vector_impl_data._M_start;
      if (local_b8._M_impl.super__Vector_impl_data._M_start !=
          local_b8._M_impl.super__Vector_impl_data._M_finish) {
        do {
          if (pHVar14 == pHVar11) {
            bVar6 = localdomain->infeasible_;
            break;
          }
          HighsDomain::changeBound(localdomain,*pHVar14,(Reason)0xfffffffe);
          bVar6 = localdomain->infeasible_;
          pHVar14 = pHVar14 + 1;
        } while ((bool)bVar6 == false);
        if ((bVar6 & 1) == 0) {
          HighsDomain::propagate(localdomain);
        }
      }
    }
    else {
      HighsDomain::propagate(localdomain);
      pHVar11 = local_b8._M_impl.super__Vector_impl_data._M_finish;
      if (localdomain->infeasible_ == false) {
        lVar13 = (long)local_b8._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_b8._M_impl.super__Vector_impl_data._M_start;
        pHVar14 = local_b8._M_impl.super__Vector_impl_data._M_start;
        for (lVar10 = lVar13 >> 6; 0 < lVar10; lVar10 = lVar10 + -1) {
          bVar5 = HighsDomain::isActive(localdomain,pHVar14);
          __first._M_current = pHVar14;
          if (bVar5) goto LAB_002e1aa9;
          bVar5 = HighsDomain::isActive(localdomain,pHVar14 + 1);
          __first._M_current = pHVar14 + 1;
          if (bVar5) goto LAB_002e1aa9;
          bVar5 = HighsDomain::isActive(localdomain,pHVar14 + 2);
          __first._M_current = pHVar14 + 2;
          if (bVar5) goto LAB_002e1aa9;
          bVar5 = HighsDomain::isActive(localdomain,pHVar14 + 3);
          __first._M_current = pHVar14 + 3;
          if (bVar5) goto LAB_002e1aa9;
          pHVar14 = pHVar14 + 4;
          lVar13 = lVar13 + -0x40;
        }
        lVar13 = lVar13 >> 4;
        if (lVar13 == 1) {
LAB_002e1a95:
          bVar5 = HighsDomain::isActive(localdomain,pHVar14);
          __first._M_current = pHVar14;
          if (!bVar5) {
            __first._M_current = pHVar11;
          }
LAB_002e1aa9:
          domchg_00 = __first._M_current;
          if (__first._M_current != pHVar11) {
            while (pHVar12 = domchg_00, domchg_00 = pHVar12 + 1, domchg_00 != pHVar11) {
              bVar5 = HighsDomain::isActive(localdomain,domchg_00);
              if (!bVar5) {
                HVar7 = pHVar12[1].column;
                HVar3 = pHVar12[1].boundtype;
                (__first._M_current)->boundval = domchg_00->boundval;
                (__first._M_current)->column = HVar7;
                (__first._M_current)->boundtype = HVar3;
                __first._M_current = __first._M_current + 1;
              }
            }
          }
        }
        else {
          if (lVar13 == 2) {
LAB_002e1a82:
            bVar5 = HighsDomain::isActive(localdomain,pHVar14);
            __first._M_current = pHVar14;
            if (!bVar5) {
              pHVar14 = pHVar14 + 1;
              goto LAB_002e1a95;
            }
            goto LAB_002e1aa9;
          }
          __first._M_current = pHVar11;
          if (lVar13 == 3) {
            bVar5 = HighsDomain::isActive(localdomain,pHVar14);
            __first._M_current = pHVar14;
            if (!bVar5) {
              pHVar14 = pHVar14 + 1;
              goto LAB_002e1a82;
            }
            goto LAB_002e1aa9;
          }
        }
        std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::erase
                  ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)&local_b8,
                   __first,(const_iterator)local_b8._M_impl.super__Vector_impl_data._M_finish);
        goto LAB_002e1af3;
      }
    }
  }
  else {
LAB_002e194b:
    do {
      if (pHVar14 == pHVar11) {
        bVar6 = localdomain->infeasible_;
        break;
      }
      HighsDomain::changeBound(localdomain,*pHVar14,(Reason)0xfffffffe);
      bVar6 = localdomain->infeasible_;
      pHVar14 = pHVar14 + 1;
    } while ((bool)bVar6 == false);
    if ((bVar6 & 1) == 0) {
      HighsDomain::propagate(localdomain);
    }
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_98);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_d8);
LAB_002e199a:
  std::_Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>::~_Vector_base(&local_b8)
  ;
  return;
}

Assistant:

void HighsRedcostFixing::propagateRedCost(const HighsMipSolver& mipsolver,
                                          HighsDomain& localdomain,
                                          const HighsLpRelaxation& lp) {
  const std::vector<double>& lpredcost = lp.getSolution().col_dual;
  double lpobjective = lp.getObjective();
  HighsCDouble gap =
      HighsCDouble(mipsolver.mipdata_->upper_limit) - lpobjective;

  double tolerance = std::max(10 * mipsolver.mipdata_->feastol,
                              mipsolver.mipdata_->epsilon * double(gap));

  assert(!localdomain.infeasible());
  std::vector<HighsDomainChange> boundChanges;
  boundChanges.reserve(mipsolver.mipdata_->integral_cols.size());
  for (HighsInt col : mipsolver.mipdata_->integral_cols) {
    // lpobj + (col - bnd) * redcost <= cutoffbound
    // (col - bnd) * redcost <= gap
    // redcost * col <= gap + redcost * bnd
    //   case bnd is upper bound  => redcost < 0 :
    //      col >= gap/redcost + ub
    //      <=> redcost < gap / (lb - ub)
    //   case bnd is lower bound  => redcost > 0 :
    //      col <= gap/redcost + lb
    //      <=> redcost > gap / (ub - lb)
    if (localdomain.col_upper_[col] == localdomain.col_lower_[col]) continue;
    if (std::fabs(lpredcost[col]) <= tolerance) continue;

    double maxIncrease = lpredcost[col] * (localdomain.col_upper_[col] -
                                           localdomain.col_lower_[col]);
    if (maxIncrease > gap) {
      assert(localdomain.col_lower_[col] != -kHighsInf);
      assert(lpredcost[col] > tolerance);
      double newub =
          double(floor(gap / lpredcost[col] + localdomain.col_lower_[col] +
                       mipsolver.mipdata_->feastol));
      if (newub >= localdomain.col_upper_[col]) continue;
      assert(newub < localdomain.col_upper_[col]);

      if (mipsolver.mipdata_->domain.isBinary(col)) {
        boundChanges.emplace_back(
            HighsDomainChange{newub, col, HighsBoundType::kUpper});
      } else {
        localdomain.changeBound(HighsBoundType::kUpper, col, newub,
                                HighsDomain::Reason::unspecified());
        if (localdomain.infeasible()) return;
      }
    } else if (maxIncrease < -gap) {
      assert(localdomain.col_upper_[col] != kHighsInf);
      assert(lpredcost[col] < -tolerance);
      double newlb =
          double(ceil(gap / lpredcost[col] + localdomain.col_upper_[col] -
                      mipsolver.mipdata_->feastol));

      if (newlb <= localdomain.col_lower_[col]) continue;
      assert(newlb > localdomain.col_lower_[col]);

      if (mipsolver.mipdata_->domain.isBinary(col)) {
        boundChanges.emplace_back(
            HighsDomainChange{newlb, col, HighsBoundType::kLower});
      } else {
        localdomain.changeBound(HighsBoundType::kLower, col, newlb,
                                HighsDomain::Reason::unspecified());
        if (localdomain.infeasible()) return;
      }
    }
  }

  if (!boundChanges.empty()) {
    std::vector<HighsInt> inds;
    std::vector<double> vals;
    double rhs;

    if (boundChanges.size() <= 100 &&
        lp.computeDualProof(mipsolver.mipdata_->domain,
                            mipsolver.mipdata_->upper_limit, inds, vals, rhs,
                            false)) {
      bool addedConstraints = false;

      HighsInt oldNumConflicts =
          mipsolver.mipdata_->conflictPool.getNumConflicts();
      for (const HighsDomainChange& domchg : boundChanges) {
        if (localdomain.isActive(domchg)) continue;
        localdomain.conflictAnalyzeReconvergence(
            domchg, inds.data(), vals.data(), inds.size(), rhs,
            mipsolver.mipdata_->conflictPool);
      }
      addedConstraints =
          mipsolver.mipdata_->conflictPool.getNumConflicts() != oldNumConflicts;

      if (addedConstraints) {
        localdomain.propagate();
        if (localdomain.infeasible()) return;

        boundChanges.erase(
            std::remove_if(boundChanges.begin(), boundChanges.end(),
                           [&](const HighsDomainChange& domchg) {
                             return localdomain.isActive(domchg);
                           }),
            boundChanges.end());
      }

      if (!boundChanges.empty()) {
        for (const HighsDomainChange& domchg : boundChanges) {
          localdomain.changeBound(domchg, HighsDomain::Reason::unspecified());
          if (localdomain.infeasible()) break;
        }

        if (!localdomain.infeasible()) localdomain.propagate();
      }
      // /printf("numConflicts: %d\n", numConflicts);
    } else {
      for (const HighsDomainChange& domchg : boundChanges) {
        localdomain.changeBound(domchg, HighsDomain::Reason::unspecified());
        if (localdomain.infeasible()) break;
      }

      if (!localdomain.infeasible()) localdomain.propagate();
    }
  }
}